

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateThrowResultException_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  ulong uVar1;
  _Base_ptr p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar4;
  size_type *psVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  VulkanHppGenerator *this_00;
  string *__return_storage_ptr___00;
  bool bVar8;
  int iVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  undefined8 uVar13;
  _Base_ptr valueName;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string strippedValue;
  string throwTemplate;
  string cases;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  _Base_ptr local_198;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  size_type *local_150;
  size_type local_148;
  size_type local_140;
  undefined8 uStack_138;
  undefined1 local_130 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Base_ptr local_f0;
  _Base_ptr local_e8;
  _Base_ptr local_e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string *local_70;
  VulkanHppGenerator *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"VkResult","");
  local_198 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
              ::find(&(this->m_enums)._M_t,&local_190.first);
  local_70 = __return_storage_ptr__;
  local_68 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
    operator_delete(local_190.first._M_dataplus._M_p,
                    local_190.first.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  p_Var6 = local_198 + 5;
  p_Var2 = local_198[5]._M_right;
  if (p_Var6->_M_left != p_Var2) {
    local_198 = local_198 + 1;
    this_00 = (VulkanHppGenerator *)((long)local_130 + 0x10);
    valueName = p_Var6->_M_left + 2;
    do {
      if ((char)valueName[2]._M_color == _S_black) {
        local_190.first._M_string_length = *(size_type *)valueName;
        local_190.first._M_dataplus._M_p = (pointer)valueName->_M_parent;
        bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_190,"VK_ERROR"
                          );
        if (bVar8) {
          generateProtection(&local_190,this_00,(string *)(valueName + 1),true);
          generateEnumValueName(&local_1d8,local_68,(string *)local_198,(string *)valueName,false);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_190.first._M_dataplus._M_p,
                     local_190.first._M_dataplus._M_p + local_190.first._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_d0,"      case Result::");
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_d0,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
          local_b0._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
          paVar11 = &pbVar10->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p == paVar11) {
            local_b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_b0._M_string_length = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_b0,": throw ");
          local_130._0_8_ = (pbVar10->_M_dataplus)._M_p;
          paVar11 = &pbVar10->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._0_8_ == paVar11) {
            local_130._16_8_ = paVar11->_M_allocated_capacity;
            local_130._24_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 8);
            local_130._28_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 0xc);
            local_130._0_8_ = this_00;
          }
          else {
            local_130._16_8_ = paVar11->_M_allocated_capacity;
          }
          local_130._8_8_ = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          local_f0 = (_Base_ptr)local_e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"eError","");
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f8,local_1d8._M_dataplus._M_p,
                     local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
          p_Var7 = local_e8;
          if ((local_e8 <= local_1f8._M_string_length) &&
             ((local_e8 == (_Base_ptr)0x0 ||
              (iVar9 = bcmp(local_1f8._M_dataplus._M_p,local_f0,(size_t)local_e8), iVar9 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_1f8,0,(size_type)p_Var7);
          }
          uVar12 = 0xf;
          if ((VulkanHppGenerator *)local_130._0_8_ != this_00) {
            uVar12 = local_130._16_8_;
          }
          uVar1 = local_1f8._M_string_length + local_130._8_8_;
          if (uVar12 < uVar1) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              uVar13 = local_1f8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < uVar1) goto LAB_001238d7;
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_1f8,0,0,(char *)local_130._0_8_,local_130._8_8_);
          }
          else {
LAB_001238d7:
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_130,local_1f8._M_dataplus._M_p,local_1f8._M_string_length)
            ;
          }
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar10->_M_dataplus)._M_p;
          paVar11 = &pbVar10->field_2;
          if (paVar3 == paVar11) {
            local_1b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_1b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_1b8._M_dataplus._M_p = (pointer)paVar3;
          }
          local_1b8._M_string_length = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar10->_M_string_length = 0;
          paVar11->_M_local_buf[0] = '\0';
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_1b8,"Error( message );\n");
          local_110._M_allocated_capacity = (size_type)&local_100;
          ppaVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     **)(pbVar10->_M_dataplus)._M_p;
          paVar11 = &pbVar10->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)ppaVar4 == paVar11) {
            local_100._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_100._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_100._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_110._M_allocated_capacity = (size_type)ppaVar4;
          }
          local_110._8_8_ = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_110,local_190.second._M_dataplus._M_p,
                                local_190.second._M_string_length);
          local_150 = &local_140;
          psVar5 = (size_type *)(pbVar10->_M_dataplus)._M_p;
          paVar11 = &pbVar10->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5 == paVar11) {
            local_140 = paVar11->_M_allocated_capacity;
            uStack_138 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_140 = paVar11->_M_allocated_capacity;
            local_150 = psVar5;
          }
          local_148 = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_90,(char *)local_150,local_148);
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_allocated_capacity != &local_100) {
            operator_delete((void *)local_110._M_allocated_capacity,
                            local_100._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if (local_f0 != (_Base_ptr)local_e0) {
            operator_delete(local_f0,(ulong)((long)&local_e0[0]->_M_color + 1));
          }
          if ((VulkanHppGenerator *)local_130._0_8_ != this_00) {
            operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190.second._M_dataplus._M_p != &local_190.second.field_2) {
            operator_delete(local_190.second._M_dataplus._M_p,
                            local_190.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
            operator_delete(local_190.first._M_dataplus._M_p,
                            local_190.first.field_2._M_allocated_capacity + 1);
          }
        }
      }
      p_Var7 = valueName + 3;
      valueName = (_Base_ptr)&valueName[5]._M_left;
    } while ((_Base_ptr)&p_Var7->_M_left != p_Var2);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
            (&local_90);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,
             "\n  namespace detail\n  {\n    [[noreturn]] VULKAN_HPP_INLINE void throwResultException( Result result, char const * message )\n    {\n      switch ( result )\n      {\n${cases}\n        default: throw SystemError( make_error_code( result ), message );\n      }\n    }\n  }"
             ,"");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_190,(char (*) [6])"cases",&local_90);
  __return_storage_ptr___00 = local_70;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_190;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_150,(allocator_type *)&local_110);
  replaceWithMap(__return_storage_ptr___00,&local_1d8,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.second._M_dataplus._M_p != &local_190.second.field_2) {
    operator_delete(local_190.second._M_dataplus._M_p,
                    local_190.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
    operator_delete(local_190.first._M_dataplus._M_p,
                    local_190.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr___00;
}

Assistant:

std::string VulkanHppGenerator::generateThrowResultException() const
{
  auto enumIt = m_enums.find( "VkResult" );

  std::string cases;
  for ( auto const & value : enumIt->second.values )
  {
    if ( value.supported && value.name.starts_with( "VK_ERROR" ) )
    {
      const auto [enter, leave] = generateProtection( value.protect );
      std::string valueName     = generateEnumValueName( enumIt->first, value.name, false );
      cases += enter + "      case Result::" + valueName + ": throw " + stripPrefix( valueName, "eError" ) + "Error( message );\n" + leave;
    }
  }
  cases.pop_back();  // remove last newline

  const std::string throwTemplate = R"(
  namespace detail
  {
    [[noreturn]] VULKAN_HPP_INLINE void throwResultException( Result result, char const * message )
    {
      switch ( result )
      {
${cases}
        default: throw SystemError( make_error_code( result ), message );
      }
    }
  })";
  return replaceWithMap( throwTemplate, { { "cases", cases } } );
}